

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bif1sc(bifcxdef *ctx,int argc)

{
  long lVar1;
  undefined4 in_ESI;
  long in_RDI;
  runcxdef *unaff_retaddr;
  objnum sc;
  objnum obj;
  int in_stack_ffffffffffffffec;
  undefined2 in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff2;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\x02') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign((runcxdef *)
            CONCAT44(in_ESI,CONCAT22(in_stack_fffffffffffffff2,in_stack_fffffffffffffff0)),
            in_stack_ffffffffffffffec);
  }
  objget1sc((mcmcxdef *)unaff_retaddr,(objnum)((ulong)in_RDI >> 0x30));
  runpobj(unaff_retaddr,(objnum)((ulong)in_RDI >> 0x30));
  return;
}

Assistant:

void bif1sc(bifcxdef *ctx, int argc)
{
    objnum obj;
    objnum sc;

    bifcntargs(ctx, 1, argc);
    obj = runpopobj(ctx->bifcxrun);
    sc = objget1sc(ctx->bifcxrun->runcxmem, obj);
    runpobj(ctx->bifcxrun, sc);
}